

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O3

void Bitmap_format_Matrix(uint8_t *dst,uint8_t *src)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  uint8_t *puVar6;
  byte *pbVar7;
  uint8_t *puVar8;
  long lVar9;
  byte *pbVar10;
  uint uVar11;
  uint32_t uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  
  if (bmp_BitCount < 0x10) {
    if (bmp_BitCount == '\x01') {
      if (bmp_height != 0) {
        uVar14 = (ulong)bmp_width;
        puVar8 = dst + bmp_height * bmp_width;
        uVar3 = 0;
        uVar12 = bmp_height;
        do {
          lVar13 = (long)puVar8 - uVar14;
          if (7 < (int)uVar14 + 7U) {
            uVar16 = 0;
            uVar12 = 0;
            do {
              lVar9 = lVar13;
              bVar1 = src[uVar16];
              bVar2 = 7;
              lVar15 = 0;
              do {
                uVar11 = (uint)lVar15;
                *(char *)(lVar9 + lVar15) =
                     (char)((0x80U >> ((byte)lVar15 & 0x1f) & (uint)bVar1) >> (bVar2 & 0x1f));
                uVar12 = uVar12 + 1;
                uVar14 = (ulong)bmp_width;
                lVar15 = lVar15 + 1;
                if (uVar12 == bmp_width) break;
                bVar2 = bVar2 - 1;
              } while (uVar11 < 7);
              uVar16 = uVar16 + 1;
              lVar13 = lVar9 + lVar15;
            } while (uVar16 < bmp_width + 7 >> 3);
            lVar13 = lVar9 + lVar15;
            uVar12 = bmp_height;
          }
          puVar8 = (uint8_t *)(lVar13 - uVar14);
          src = src + bytesPerLine;
          uVar3 = uVar3 + 1;
        } while (uVar3 < uVar12);
      }
    }
    else if (bmp_BitCount == '\x04') {
      if (bmp_height != 0) {
        pbVar10 = dst + bmp_height * bmp_width;
        uVar3 = 0;
        uVar12 = bmp_height;
        uVar5 = bmp_width;
        do {
          pbVar7 = pbVar10 + -(ulong)uVar5;
          lVar13 = -(ulong)uVar5;
          if (1 < uVar5 + 1) {
            pbVar10 = pbVar10 + lVar13 + 1;
            uVar12 = 2;
            uVar14 = 0;
            do {
              bVar1 = src[uVar14];
              pbVar10[-1] = bVar1 >> 4;
              if (uVar12 - 1 == bmp_width) {
                pbVar7 = pbVar7 + 1;
                uVar5 = uVar12 - 1;
                break;
              }
              *pbVar10 = bVar1 & 0xf;
              if (uVar12 == bmp_width) {
                pbVar7 = pbVar10 + 1;
                uVar5 = uVar12;
                break;
              }
              pbVar7 = pbVar7 + 2;
              uVar14 = uVar14 + 1;
              uVar12 = uVar12 + 2;
              pbVar10 = pbVar10 + 2;
              uVar5 = bmp_width;
            } while (uVar14 < bmp_width + 1 >> 1);
            lVar13 = -(ulong)uVar5;
            uVar12 = bmp_height;
          }
          pbVar10 = pbVar7 + lVar13;
          src = src + bytesPerLine;
          uVar3 = uVar3 + 1;
        } while (uVar3 < uVar12);
      }
    }
    else if ((bmp_BitCount == '\b') && (bmp_height != 0)) {
      puVar8 = dst + bmp_height * bmp_width;
      uVar3 = 0;
      iVar4 = 1;
      uVar12 = bmp_height;
      uVar5 = bmp_width;
      do {
        if (uVar5 == 0) {
          uVar5 = 0;
        }
        else {
          uVar14 = (ulong)skip;
          uVar11 = bytesPerLine * iVar4;
          lVar15 = -1;
          lVar13 = 0;
          do {
            puVar8[lVar15] = src[lVar15 + (uVar11 - uVar14)];
            lVar15 = lVar15 + -1;
            lVar13 = lVar13 + 1;
          } while ((uint)lVar13 < bmp_width);
          puVar8 = puVar8 + -lVar13;
          uVar12 = bmp_height;
          uVar5 = bmp_width;
        }
        uVar3 = uVar3 + 1;
        iVar4 = iVar4 + 1;
      } while (uVar3 < uVar12);
    }
  }
  else if (bmp_BitCount == '\x10') {
    if (bmp_height != 0) {
      puVar8 = dst + bmp_width * bmp_height * 2;
      uVar3 = 0;
      iVar4 = 1;
      uVar12 = bmp_height;
      uVar5 = bmp_width;
      do {
        if (uVar5 == 0) {
          uVar5 = 0;
        }
        else {
          puVar6 = src + ((ulong)(bytesPerLine * iVar4) - (ulong)skip) + -1;
          uVar11 = 0;
          do {
            puVar8[-2] = *puVar6;
            puVar8[-1] = puVar6[-1];
            puVar8 = puVar8 + -2;
            uVar11 = uVar11 + 1;
            puVar6 = puVar6 + -2;
            uVar12 = bmp_height;
            uVar5 = bmp_width;
          } while (uVar11 < bmp_width);
        }
        uVar3 = uVar3 + 1;
        iVar4 = iVar4 + 1;
      } while (uVar3 < uVar12);
    }
  }
  else if (bmp_BitCount == '\x18') {
    if (bmp_height != 0) {
      puVar8 = dst + bmp_width * bmp_height * 3;
      uVar3 = 0;
      iVar4 = 1;
      uVar12 = bmp_height;
      uVar5 = bmp_width;
      do {
        if (uVar5 == 0) {
          uVar5 = 0;
        }
        else {
          puVar6 = src + ((ulong)(bytesPerLine * iVar4) - (ulong)skip) + -1;
          uVar11 = 0;
          do {
            puVar8[-3] = *puVar6;
            puVar8[-2] = puVar6[-1];
            puVar8[-1] = puVar6[-2];
            puVar8 = puVar8 + -3;
            uVar11 = uVar11 + 1;
            puVar6 = puVar6 + -3;
            uVar12 = bmp_height;
            uVar5 = bmp_width;
          } while (uVar11 < bmp_width);
        }
        uVar3 = uVar3 + 1;
        iVar4 = iVar4 + 1;
      } while (uVar3 < uVar12);
    }
  }
  else if ((bmp_BitCount == ' ') && (bmp_height != 0)) {
    puVar8 = dst + bmp_width * bmp_height * 4;
    uVar3 = 0;
    iVar4 = 4;
    uVar12 = bmp_height;
    uVar5 = bmp_width;
    do {
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        puVar6 = src + ((ulong)(uVar5 * iVar4) - 1);
        uVar11 = 0;
        do {
          puVar8[-4] = puVar6[-1];
          puVar8[-3] = puVar6[-2];
          puVar8[-2] = puVar6[-3];
          puVar8[-1] = *puVar6;
          puVar8 = puVar8 + -4;
          uVar11 = uVar11 + 1;
          puVar6 = puVar6 + -4;
          uVar12 = bmp_height;
          uVar5 = bmp_width;
        } while (uVar11 < bmp_width);
      }
      uVar3 = uVar3 + 1;
      iVar4 = iVar4 + 4;
    } while (uVar3 < uVar12);
  }
  return;
}

Assistant:

static void Bitmap_format_Matrix(uint8_t *dst,uint8_t *src)
{
	uint32_t i,j,k;
    uint8_t *psrc = src;
    uint8_t *pdst = dst;
    uint8_t *p = psrc;
	uint8_t temp;
	uint32_t count;
	
	//����bmp�洢�ǴӺ�����ǰ�棬������Ҫ��������ת��
	switch(bmp_BitCount)
	{
		case 1:
			pdst += (bmp_width * bmp_height);
			
			for(i=0;i<bmp_height;i++)
			{
				pdst -= bmp_width;
				count = 0;
				for (j=0;j<(bmp_width+7)/8;j++)
				{
					temp = p[j];
					
					for (k=0;k<8;k++)
					{
						pdst[0]= ((temp & (0x80>>k)) >> (7-k));
						count++;
						pdst++;
						if (count == bmp_width)
						{
							break;
						}
					}
				}
				pdst -= bmp_width;
				p += bytesPerLine;
			}
		break;
		case 4:
			pdst += (bmp_width * bmp_height);

			for(i=0;i<bmp_height;i++)
			{
				pdst -= bmp_width;
				count = 0;
				for (j=0;j<(bmp_width+1)/2;j++)
				{
					temp = p[j];
					pdst[0]= ((temp & 0xf0) >> 4);
					count++;
					pdst++;
					if (count == bmp_width)
					{
						break;
					}

					pdst[0] = temp & 0x0f;
					count++;
					pdst++;
					if (count == bmp_width)
					{
						break;
					}
				}
				pdst -= bmp_width;
				p += bytesPerLine;
			}
		break;
		case 8:
			pdst += (bmp_width*bmp_height);
			for(i=0;i<bmp_height;i++)
			{
				p = psrc+(i+1)*bytesPerLine;
				p -= skip;
				for(j=0;j<bmp_width;j++)
				{
					pdst -= 1;
					p -= 1;
					pdst[0] = p[0];
				}
			}
		break;
		case 16:
			pdst += (bmp_width*bmp_height*2);
			for(i=0;i<bmp_height;i++)
			{
				p = psrc+(i+1)*bytesPerLine;
				p -= skip;
				for(j=0;j<bmp_width;j++)
				{
					pdst -= 2;
					p -= 2;
					pdst[0] = p[1];
					pdst[1] = p[0];
				}
			}
		break;
		case 24:
			pdst += (bmp_width*bmp_height*3);
			for(i=0;i<bmp_height;i++)
			{
				p = psrc+(i+1)*bytesPerLine;
				p -= skip;
				for(j=0;j<bmp_width;j++)
				{
					pdst -= 3;
					p -= 3;
					pdst[0] = p[2];
					pdst[1] = p[1];
					pdst[2] = p[0];
				}
			}
		break;
		case 32:
			pdst += (bmp_width*bmp_height*4);
			for(i=0;i<bmp_height;i++)
			{
				p = psrc+(i+1)*bmp_width*4;
				for(j=0;j<bmp_width;j++)
				{
					pdst -= 4;
					p -= 4;
					pdst[0] = p[2];
					pdst[1] = p[1];
					pdst[2] = p[0];
					pdst[3] = p[3];
				}
			}
		break;
		
		default:
		break;
	}	
}